

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O2

void __thiscall
tlx::CmdlineParser::add_opt_param_stringlist
          (CmdlineParser *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dest,string *desc)

{
  ArgumentStringlist *this_00;
  allocator local_59;
  string local_58;
  ArgumentStringlist *local_38;
  
  this_00 = (ArgumentStringlist *)operator_new(0x80);
  std::__cxx11::string::string((string *)&local_58,"",&local_59);
  ArgumentStringlist::ArgumentStringlist(this_00,'\0',name,&local_58,desc,false,dest);
  local_38 = this_00;
  std::vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>::
  emplace_back<tlx::CmdlineParser::ArgumentStringlist*>
            ((vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>> *)
             &this->param_list_,&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  calc_param_max(this,(this->param_list_).
                      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1]);
  return;
}

Assistant:

void CmdlineParser::add_opt_param_stringlist(
    const std::string& name, std::vector<std::string>& dest,
    const std::string& desc) {
    param_list_.emplace_back(
        new ArgumentStringlist(0, name, "", desc, false, dest));
    calc_param_max(param_list_.back());
}